

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.h
# Opt level: O0

int __thiscall jrtplib::RTPPacketBuilder::IncrementTimestampDefault(RTPPacketBuilder *this)

{
  RTPPacketBuilder *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x14;
  }
  else if ((this->deftsset & 1U) == 0) {
    this_local._4_4_ = -0x12;
  }
  else {
    this->timestamp = this->defaulttimestampinc + this->timestamp;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

inline int RTPPacketBuilder::IncrementTimestampDefault()
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	if (!deftsset)
		return ERR_RTP_PACKBUILD_DEFAULTTSINCNOTSET;
	timestamp += defaulttimestampinc;
	return 0;
}